

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t local_c8;
  undefined1 local_90 [8];
  ZSTD_cwksp ws;
  ZSTD_CDict *cdict;
  size_t neededSize;
  size_t matchStateSize;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  size_t workspaceSize_local;
  void *workspace_local;
  
  sVar2 = ZSTD_sizeof_matchState(&cParams,0);
  sVar3 = ZSTD_cwksp_alloc_size(0x1340);
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    local_c8 = 0;
  }
  else {
    sVar4 = ZSTD_cwksp_align(dictSize,8);
    local_c8 = ZSTD_cwksp_alloc_size(sVar4);
  }
  sVar4 = ZSTD_cwksp_alloc_size(0x1800);
  if (((ulong)workspace & 7) == 0) {
    ZSTD_cwksp_init((ZSTD_cwksp *)local_90,workspace,workspaceSize);
    ws._56_8_ = ZSTD_cwksp_reserve_object((ZSTD_cwksp *)local_90,0x1340);
    if ((void *)ws._56_8_ == (void *)0x0) {
      workspace_local = (void *)0x0;
    }
    else {
      ZSTD_cwksp_move((ZSTD_cwksp *)(ws._56_8_ + 0x18),(ZSTD_cwksp *)local_90);
      if (workspaceSize < sVar3 + local_c8 + sVar4 + sVar2) {
        workspace_local = (void *)0x0;
      }
      else {
        sVar2 = ZSTD_initCDict_internal
                          ((ZSTD_CDict *)ws._56_8_,dict,dictSize,dictLoadMethod,dictContentType,
                           cParams);
        uVar1 = ZSTD_isError(sVar2);
        if (uVar1 == 0) {
          workspace_local = (void *)ws._56_8_;
        }
        else {
          workspace_local = (void *)0x0;
        }
      }
    }
  }
  else {
    workspace_local = (void *)0x0;
  }
  return (ZSTD_CDict *)workspace_local;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              cParams) ))
        return NULL;

    return cdict;
}